

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageUtil.cpp
# Opt level: O2

MovePtr<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_> *
__thiscall
deqp::egl::Image::TextureImageSource::createBuffer
          (MovePtr<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_>
           *__return_storage_ptr__,TextureImageSource *this,Functions *gl,Texture2D *ref)

{
  GLuint GVar1;
  GLenum GVar2;
  GLenum GVar3;
  EGLenum source;
  GLenum GVar4;
  TextureClientBuffer *pTVar5;
  MovePtr<deqp::egl::Image::TextureClientBuffer,_de::DefaultDeleter<deqp::egl::Image::TextureClientBuffer>_>
  clientBuffer;
  Vec4 local_98;
  Texture3D local_88;
  
  pTVar5 = (TextureClientBuffer *)operator_new(0x20);
  TextureClientBuffer::TextureClientBuffer(pTVar5,gl);
  clientBuffer.
  super_UniqueBase<deqp::egl::Image::TextureClientBuffer,_de::DefaultDeleter<deqp::egl::Image::TextureClientBuffer>_>
  .m_data.ptr = pTVar5;
  GVar1 = (*(pTVar5->super_GLClientBuffer).super_ClientBuffer._vptr_ClientBuffer[3])(pTVar5);
  GVar2 = (*(this->super_GLImageSource).super_ImageSource._vptr_ImageSource[9])(this);
  (*gl->bindTexture)(GVar2,GVar1);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"bindTexture(target, texture)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                  ,0xee);
  (*(this->super_GLImageSource).super_ImageSource._vptr_ImageSource[8])(this);
  if (this->m_useTexLevel0 == false) {
    (*gl->texParameteri)(GVar2,0x2801,0x2601);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"texParameteri(target, GL_TEXTURE_MIN_FILTER, GL_LINEAR)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0xf4);
  }
  if (ref != (Texture2D *)0x0) {
    source = (*(this->super_GLImageSource).super_ImageSource._vptr_ImageSource[7])(this);
    GVar3 = eglu::getImageGLTarget(source);
    local_98.m_data._0_8_ = glu::mapGLTransferFormat(this->m_format,this->m_type);
    tcu::Texture2D::Texture2D((Texture2D *)&local_88,(TextureFormat *)&local_98,0x40,0x40);
    tcu::Texture2D::operator=(ref,(Texture2D *)&local_88);
    tcu::Texture3D::~Texture3D(&local_88);
    tcu::Texture2D::allocLevel(ref,0);
    local_88.super_TextureLevelPyramid.m_format.order = R;
    local_88.super_TextureLevelPyramid.m_format.type = SNORM_INT8;
    local_88.super_TextureLevelPyramid.m_data.
    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.m_data[0] = 1.0;
    local_98.m_data[1] = 1.0;
    local_98.m_data[2] = 1.0;
    local_98.m_data[3] = 1.0;
    tcu::fillWithComponentGradients
              ((ref->super_TextureLevelPyramid).m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start,(Vec4 *)&local_88,&local_98);
    (*gl->texParameteri)(GVar2,0x2801,0x2601);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"texParameteri(target, GL_TEXTURE_MIN_FILTER, GL_LINEAR)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x101);
    (*gl->texParameteri)(GVar2,0x2800,0x2601);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"texParameteri(target, GL_TEXTURE_MAG_FILTER, GL_LINEAR)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x102);
    (*gl->texParameteri)(GVar2,0x2803,0x812f);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"texParameteri(target, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x103);
    (*gl->texParameteri)(GVar2,0x2802,0x812f);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"texParameteri(target, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x104);
    (*gl->texImage2D)(GVar3,0,this->m_internalFormat,0x40,0x40,0,this->m_format,this->m_type,
                      (((ref->super_TextureLevelPyramid).m_access.
                        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                        ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).
                      m_data);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,
                    "texImage2D(imgTarget, 0, m_internalFormat, IMAGE_WIDTH, IMAGE_HEIGHT, 0, m_format, m_type, ref->getLevel(0).getDataPtr())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x107);
  }
  (*gl->bindTexture)(GVar2,0);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"bindTexture(target, 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                  ,0x109);
  pTVar5 = clientBuffer.
           super_UniqueBase<deqp::egl::Image::TextureClientBuffer,_de::DefaultDeleter<deqp::egl::Image::TextureClientBuffer>_>
           .m_data.ptr;
  clientBuffer.
  super_UniqueBase<deqp::egl::Image::TextureClientBuffer,_de::DefaultDeleter<deqp::egl::Image::TextureClientBuffer>_>
  .m_data.ptr = (TextureClientBuffer *)0x0;
  (__return_storage_ptr__->
  super_UniqueBase<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_>
  ).m_data.ptr = (ClientBuffer *)pTVar5;
  de::details::
  UniqueBase<deqp::egl::Image::TextureClientBuffer,_de::DefaultDeleter<deqp::egl::Image::TextureClientBuffer>_>
  ::~UniqueBase(&clientBuffer.
                 super_UniqueBase<deqp::egl::Image::TextureClientBuffer,_de::DefaultDeleter<deqp::egl::Image::TextureClientBuffer>_>
               );
  return __return_storage_ptr__;
}

Assistant:

MovePtr<ClientBuffer> TextureImageSource::createBuffer (const glw::Functions& gl, Texture2D* ref) const
{
	MovePtr<TextureClientBuffer>	clientBuffer	(new TextureClientBuffer(gl));
	const GLuint					texture			= clientBuffer->getName();
	const GLenum					target			= getGLTarget();

	GLU_CHECK_GLW_CALL(gl, bindTexture(target, texture));
	initTexture(gl);

	if (!m_useTexLevel0)
	{
		// Set minification filter to linear. This makes the texture complete.
		GLU_CHECK_GLW_CALL(gl, texParameteri(target, GL_TEXTURE_MIN_FILTER, GL_LINEAR));
	}

	if (ref != DE_NULL)
	{
		GLenum		imgTarget	= eglu::getImageGLTarget(getSource());

		*ref = Texture2D(glu::mapGLTransferFormat(m_format, m_type), IMAGE_WIDTH, IMAGE_HEIGHT);
		ref->allocLevel(0);
		tcu::fillWithComponentGradients(ref->getLevel(0),
										tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f),
										tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));

		GLU_CHECK_GLW_CALL(gl, texParameteri(target, GL_TEXTURE_MIN_FILTER, GL_LINEAR));
		GLU_CHECK_GLW_CALL(gl, texParameteri(target, GL_TEXTURE_MAG_FILTER, GL_LINEAR));
		GLU_CHECK_GLW_CALL(gl, texParameteri(target, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE));
		GLU_CHECK_GLW_CALL(gl, texParameteri(target, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE));

		GLU_CHECK_GLW_CALL(gl, texImage2D(imgTarget, 0, m_internalFormat, IMAGE_WIDTH, IMAGE_HEIGHT,
										  0, m_format, m_type, ref->getLevel(0).getDataPtr()));
	}
	GLU_CHECK_GLW_CALL(gl, bindTexture(target, 0));
	return MovePtr<ClientBuffer>(clientBuffer);
}